

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-literal.cc
# Opt level: O2

void __thiscall WriteUint128_BufferTooSmall_Test::TestBody(WriteUint128_BufferTooSmall_Test *this)

{
  undefined1 auVar1 [16];
  int line;
  undefined8 in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rhs;
  char *pcVar2;
  AssertionResult *this_00;
  AssertionResult *message;
  v128 bits;
  char buffer_1 [3];
  AssertionResult gtest_ar_1;
  char buffer [20];
  string actual;
  AssertHelper local_20;
  
  bits.v._8_8_ = in_R8;
  bits.v[0] = 0xff;
  bits.v[1] = 0xff;
  bits.v[2] = 0xff;
  bits.v[3] = 0xff;
  bits.v[4] = 0xff;
  bits.v[5] = 0xff;
  bits.v[6] = 0xff;
  bits.v[7] = 0xff;
  wabt::WriteUint128((wabt *)buffer,(char *)0x14,0xffffffffffffffff,bits);
  gtest_ar_1.success_ = false;
  testing::internal::CmpHelperEQ<char,char>
            ((internal *)&actual,"buffer[19]","\'\\0\'",buffer + 0x13,&gtest_ar_1.success_);
  if ((char)actual._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (actual._M_string_length == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)actual._M_string_length;
    }
    this_00 = (AssertionResult *)buffer_1;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_00,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-literal.cc"
               ,0x33a,pcVar2);
    message = &gtest_ar_1;
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&actual._M_string_length);
    actual._M_dataplus._M_p = (pointer)&actual.field_2;
    rhs = &actual;
    std::__cxx11::string::_M_construct<char*>((string *)rhs,buffer,buffer + 0x13);
    testing::internal::CmpHelperEQ<char[20],std::__cxx11::string>
              ((internal *)&gtest_ar_1,"\"3402823669209384634\"","actual",
               (char (*) [20])"3402823669209384634",rhs);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)buffer_1);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)gtest_ar_1.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_20,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-literal.cc"
                 ,0x33c,pcVar2);
      testing::internal::AssertHelper::operator=(&local_20,(Message *)buffer_1);
      testing::internal::AssertHelper::~AssertHelper(&local_20);
      if ((tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )_buffer_1 !=
          (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           )0x0) {
        (**(code **)(*(long *)_buffer_1 + 8))();
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_1.message_);
      std::__cxx11::string::_M_dispose();
      return;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_1.message_);
    std::__cxx11::string::_M_dispose();
    auVar1._8_8_ = 0;
    auVar1._0_8_ = rhs;
    wabt::WriteUint128((wabt *)buffer_1,(char *)0x3,0x7b,(v128)(auVar1 << 0x40));
    buffer[0] = '1';
    testing::internal::CmpHelperEQ<char,char>
              ((internal *)&actual,"buffer[0]","\'1\'",buffer_1,buffer);
    if ((char)actual._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)buffer);
      if (actual._M_string_length == 0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)actual._M_string_length;
      }
      line = 0x342;
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&actual._M_string_length);
      buffer[0] = '2';
      testing::internal::CmpHelperEQ<char,char>
                ((internal *)&actual,"buffer[1]","\'2\'",buffer_1 + 1,buffer);
      if ((char)actual._M_dataplus._M_p != '\0') {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&actual._M_string_length);
        buffer[0] = '\0';
        testing::internal::CmpHelperEQ<char,char>
                  ((internal *)&actual,"buffer[2]","\'\\0\'",buffer_1 + 2,buffer);
        if ((char)actual._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)buffer);
          if (actual._M_string_length == 0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = *(char **)actual._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_1,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-literal.cc"
                     ,0x344,pcVar2);
          testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)buffer);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
          if ((long *)CONCAT71(buffer._1_7_,buffer[0]) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT71(buffer._1_7_,buffer[0]) + 8))();
          }
        }
        goto LAB_00146116;
      }
      testing::Message::Message((Message *)buffer);
      if (actual._M_string_length == 0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)actual._M_string_length;
      }
      line = 0x343;
    }
    this_00 = &gtest_ar_1;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-literal.cc"
               ,line,pcVar2);
    message = (AssertionResult *)buffer;
  }
  testing::internal::AssertHelper::operator=((AssertHelper *)this_00,(Message *)message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
  if (*(long **)message != (long *)0x0) {
    (**(code **)(**(long **)message + 8))();
  }
LAB_00146116:
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&actual._M_string_length);
  return;
}

Assistant:

TEST(WriteUint128, BufferTooSmall) {
  {
    char buffer[20];
    WriteUint128(buffer, 20, {0xffffffff, 0xffffffff, 0xffffffff, 0xffffffff});
    ASSERT_EQ(buffer[19], '\0');
    std::string actual(buffer, buffer + 19);
    ASSERT_EQ("3402823669209384634", actual);
  }

  {
    char buffer[3];
    WriteUint128(buffer, 3, {123, 0, 0, 0});
    ASSERT_EQ(buffer[0], '1');
    ASSERT_EQ(buffer[1], '2');
    ASSERT_EQ(buffer[2], '\0');
  }
}